

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * dlopen(char *filename,int flag)

{
  libwrap *plVar1;
  libwrap *wrap;
  void *ret;
  int flag_local;
  char *filename_local;
  
  filename_local = (char *)dlwrap_real_dlopen(filename,flag);
  plVar1 = find_wrapped_library(filename);
  if (plVar1 != (libwrap *)0x0) {
    plVar1->handle = filename_local;
    filename_local = (char *)plVar1;
  }
  return filename_local;
}

Assistant:

void *
dlopen(const char *filename, int flag)
{
    void *ret;
    struct libwrap *wrap;

    /* Before deciding whether to redirect this dlopen to our own
     * library, we call the real dlopen. This assures that any
     * expected side-effects from loading the intended library are
     * resolved. Below, we may still return a handle pointing to
     * our own library, and not what is opened here. */
    ret = dlwrap_real_dlopen(filename, flag);

    /* If filename is not a wrapped library, just return real dlopen */
    wrap = find_wrapped_library(filename);
    if (!wrap)
        return ret;

    wrap->handle = ret;

    /* We use wrapped_libs as our handles to libraries. */
    return wrap;
}